

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlCtxtSetPrivate(void)

{
  int iVar1;
  int iVar2;
  xmlParserCtxtPtr val;
  void *val_00;
  int local_2c;
  int n_priv;
  void *priv;
  int n_ctxt;
  xmlParserCtxtPtr ctxt;
  int mem_base;
  int test_ret;
  
  ctxt._4_4_ = 0;
  for (priv._4_4_ = 0; (int)priv._4_4_ < 3; priv._4_4_ = priv._4_4_ + 1) {
    for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_xmlParserCtxtPtr(priv._4_4_,0);
      val_00 = gen_void_ptr(local_2c,1);
      xmlCtxtSetPrivate(val,val_00);
      call_tests = call_tests + 1;
      des_xmlParserCtxtPtr(priv._4_4_,val,0);
      des_void_ptr(local_2c,val_00,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCtxtSetPrivate",(ulong)(uint)(iVar2 - iVar1));
        ctxt._4_4_ = ctxt._4_4_ + 1;
        printf(" %d",(ulong)priv._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ctxt._4_4_;
}

Assistant:

static int
test_xmlCtxtSetPrivate(void) {
    int test_ret = 0;

    int mem_base;
    xmlParserCtxtPtr ctxt; /* parser context */
    int n_ctxt;
    void * priv; /* private application data */
    int n_priv;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlParserCtxtPtr;n_ctxt++) {
    for (n_priv = 0;n_priv < gen_nb_void_ptr;n_priv++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlParserCtxtPtr(n_ctxt, 0);
        priv = gen_void_ptr(n_priv, 1);

        xmlCtxtSetPrivate(ctxt, priv);
        call_tests++;
        des_xmlParserCtxtPtr(n_ctxt, ctxt, 0);
        des_void_ptr(n_priv, priv, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlCtxtSetPrivate",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_priv);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}